

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void Imf_2_5::staticInitialize(void)

{
  Lock lock;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  Mutex *in_stack_ffffffffffffffe8;
  Lock *in_stack_fffffffffffffff0;
  
  IlmThread_2_5::Lock::Lock
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,(bool)in_stack_ffffffffffffffe7);
  if ((staticInitialize::initialized & 1U) == 0) {
    TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<float>_>_>::registerAttributeType();
    TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_>::registerAttributeType();
    TypedAttribute<Imf_2_5::ChannelList>::registerAttributeType();
    TypedAttribute<Imf_2_5::Compression>::registerAttributeType();
    TypedAttribute<Imf_2_5::Chromaticities>::registerAttributeType();
    TypedAttribute<Imf_2_5::DeepImageState>::registerAttributeType();
    TypedAttribute<double>::registerAttributeType();
    TypedAttribute<Imf_2_5::Envmap>::registerAttributeType();
    TypedAttribute<float>::registerAttributeType();
    TypedAttribute<std::vector<float,_std::allocator<float>_>_>::registerAttributeType();
    TypedAttribute<int>::registerAttributeType();
    TypedAttribute<Imf_2_5::KeyCode>::registerAttributeType();
    TypedAttribute<Imf_2_5::LineOrder>::registerAttributeType();
    TypedAttribute<Imath_2_5::Matrix33<double>_>::registerAttributeType();
    TypedAttribute<Imath_2_5::Matrix33<float>_>::registerAttributeType();
    TypedAttribute<Imath_2_5::Matrix44<double>_>::registerAttributeType();
    TypedAttribute<Imath_2_5::Matrix44<float>_>::registerAttributeType();
    TypedAttribute<Imf_2_5::PreviewImage>::registerAttributeType();
    TypedAttribute<Imf_2_5::Rational>::registerAttributeType();
    TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::registerAttributeType();
    TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::registerAttributeType();
    TypedAttribute<Imf_2_5::TileDescription>::registerAttributeType();
    TypedAttribute<Imf_2_5::TimeCode>::registerAttributeType();
    TypedAttribute<Imath_2_5::Vec2<double>_>::registerAttributeType();
    TypedAttribute<Imath_2_5::Vec2<float>_>::registerAttributeType();
    TypedAttribute<Imath_2_5::Vec2<int>_>::registerAttributeType();
    TypedAttribute<Imath_2_5::Vec3<double>_>::registerAttributeType();
    TypedAttribute<Imath_2_5::Vec3<float>_>::registerAttributeType();
    TypedAttribute<Imath_2_5::Vec3<int>_>::registerAttributeType();
    DwaCompressor::initializeFuncs();
    staticInitialize::initialized = true;
  }
  IlmThread_2_5::Lock::~Lock((Lock *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  return;
}

Assistant:

void
staticInitialize ()
{
    static Mutex criticalSection;
    Lock lock (criticalSection);

    static bool initialized = false;

    if (!initialized)
    {
	//
	// One-time initialization -- register
	// some predefined attribute types.
	//
	
	Box2fAttribute::registerAttributeType();
	Box2iAttribute::registerAttributeType();
	ChannelListAttribute::registerAttributeType();
	CompressionAttribute::registerAttributeType();
	ChromaticitiesAttribute::registerAttributeType();
	DeepImageStateAttribute::registerAttributeType();
	DoubleAttribute::registerAttributeType();
	EnvmapAttribute::registerAttributeType();
	FloatAttribute::registerAttributeType();
	FloatVectorAttribute::registerAttributeType();
	IntAttribute::registerAttributeType();
	KeyCodeAttribute::registerAttributeType();
	LineOrderAttribute::registerAttributeType();
	M33dAttribute::registerAttributeType();
	M33fAttribute::registerAttributeType();
	M44dAttribute::registerAttributeType();
	M44fAttribute::registerAttributeType();
	PreviewImageAttribute::registerAttributeType();
	RationalAttribute::registerAttributeType();
	StringAttribute::registerAttributeType();
        StringVectorAttribute::registerAttributeType();
	TileDescriptionAttribute::registerAttributeType();
	TimeCodeAttribute::registerAttributeType();
	V2dAttribute::registerAttributeType();
	V2fAttribute::registerAttributeType();
	V2iAttribute::registerAttributeType();
	V3dAttribute::registerAttributeType();
	V3fAttribute::registerAttributeType();
	V3iAttribute::registerAttributeType();
	DwaCompressor::initializeFuncs();

	initialized = true;
    }
}